

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QByteArray * qt_convert_to_local_8bit(QByteArray *__return_storage_ptr__,QStringView string)

{
  long in_FS_OFFSET;
  undefined8 *local_68;
  qsizetype local_60;
  storage_type_conflict *local_58;
  undefined8 local_50;
  State local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (string.m_data == (storage_type_conflict *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_50 = 0x666b40;
    local_48.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_48._20_8_ = 0;
    local_48.field_4.state_data[1] = 0;
    local_48.field_4.state_data[2] = 0;
    local_48.field_4.state_data[3] = 0;
    local_48.clearFn = (ClearDataFn)0x0;
    local_68 = &local_50;
    local_60 = string.m_size;
    local_58 = string.m_data;
    QStringEncoder::DecodedData::operator_cast_to_QByteArray
              (__return_storage_ptr__,(DecodedData *)&local_68);
    QStringConverterBase::State::clear(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qt_convert_to_local_8bit(QStringView string)
{
    if (string.isNull())
        return QByteArray();
    QStringEncoder fromUtf16(QStringEncoder::System, QStringEncoder::Flag::Stateless);
    return fromUtf16(string);
}